

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint16_t mipsdsp_sat16_sub(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  
  if (-1 < (short)((a - b ^ a) & (b ^ a))) {
    return a - b;
  }
  pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
  *pbVar1 = *pbVar1 | 0x10;
  return 0x7fff - (a >> 0xf);
}

Assistant:

static inline uint16_t mipsdsp_sat16_sub(int16_t a, int16_t b,
                                         CPUMIPSState *env)
{
    int16_t  temp;

    temp = a - b;
    if (MIPSDSP_OVERFLOW_SUB(a, b, temp, 0x8000)) {
        if (a >= 0) {
            temp = 0x7FFF;
        } else {
            temp = 0x8000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp;
}